

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

list * __thiscall DataGroup_PY::getNamedEntries_PY(list *__return_storage_ptr__,DataGroup_PY *this)

{
  vector<DL::Data,_std::allocator<DL::Data>_> *__x;
  pointer pDVar1;
  vector_t<Data> l;
  Data v;
  vector<DL::Data,_std::allocator<DL::Data>_> local_100;
  Data local_e8;
  Data local_88;
  
  __x = (vector<DL::Data,_std::allocator<DL::Data>_> *)DL::DataGroup::getNamedEntries();
  std::vector<DL::Data,_std::allocator<DL::Data>_>::vector(&local_100,__x);
  boost::python::detail::list_base::list_base(&__return_storage_ptr__->super_list_base);
  for (pDVar1 = local_100.super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
                super__Vector_impl_data._M_start;
      pDVar1 != local_100.super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
                super__Vector_impl_data._M_finish; pDVar1 = pDVar1 + 1) {
    DL::Data::Data(&local_88,pDVar1);
    DL::Data::Data(&local_e8,&local_88);
    boost::python::list::append<Data_PY>(__return_storage_ptr__,(Data_PY *)&local_e8);
    DL::Data::~Data(&local_e8);
    DL::Data::~Data(&local_88);
  }
  std::vector<DL::Data,_std::allocator<DL::Data>_>::~vector(&local_100);
  return __return_storage_ptr__;
}

Assistant:

bpy::list getNamedEntries_PY() const
	{
		auto l = getNamedEntries();
		bpy::list pyl;
		for (auto v : l)
			pyl.append(Data_PY(v));
		return pyl;
	}